

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_synthesis.cpp
# Opt level: O0

void __thiscall ColValCondDAGNode::~ColValCondDAGNode(ColValCondDAGNode *this)

{
  ColValCondDAGNode *this_local;
  
  ~ColValCondDAGNode(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

~ColValCondDAGNode() final {
    }